

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::FieldDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  size_t in_R9;
  bool bVar1;
  string_view format;
  ulong local_38;
  char *local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = (this->field_0x1 & 8) != 0;
  if (bVar1) {
    local_30 = (this->containing_type_->all_names_).payload_;
    local_38 = (ulong)*(ushort *)(local_30 + 2);
    local_30 = local_30 + ~local_38;
    format._M_str = (char *)&local_38;
    format._M_len = (size_t)"extend .$0 {\n";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0xd,format,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
  }
  DebugString(this,(uint)bVar1,__return_storage_ptr__,debug_string_options);
  if ((this->field_0x1 & 8) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  int depth = 0;
  if (is_extension()) {
    absl::SubstituteAndAppend(&contents, "extend .$0 {\n",
                              containing_type()->full_name());
    depth = 1;
  }
  DebugString(depth, &contents, debug_string_options);
  if (is_extension()) {
    contents.append("}\n");
  }
  return contents;
}